

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
flatbuffers::ResizeContext::Straddle<int,_1>
          (ResizeContext *this,void *first,void *second,void *offsetloc)

{
  int iVar1;
  uint8_t *puVar2;
  void *offsetloc_local;
  void *second_local;
  void *first_local;
  ResizeContext *this_local;
  
  if ((first <= this->startptr_) && (this->startptr_ <= second)) {
    iVar1 = ReadScalar<int>(offsetloc);
    WriteScalar<int>(offsetloc,iVar1 - this->delta_);
    puVar2 = DagCheck(this,offsetloc);
    *puVar2 = '\x01';
  }
  return;
}

Assistant:

void Straddle(const void *first, const void *second, void *offsetloc) {
    if (first <= startptr_ && second >= startptr_) {
      WriteScalar<T>(offsetloc, ReadScalar<T>(offsetloc) + delta_ * D);
      DagCheck(offsetloc) = true;
    }
  }